

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O1

StreamingConcatenationExpressionSyntax * __thiscall
slang::parsing::Parser::parseStreamConcatenation(Parser *this,Token openBrace)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  SourceLocation SVar4;
  StreamExpressionSyntax *pSVar5;
  undefined4 extraout_var;
  StreamingConcatenationExpressionSyntax *pSVar6;
  Info *pIVar7;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  Info *extraout_RDX_04;
  undefined8 uVar8;
  TokenKind TVar9;
  Token operatorToken;
  Token TVar10;
  Token openBrace_00;
  Token closeBraceInner;
  Token openBraceInner;
  Token local_248;
  Token local_238;
  ExpressionSyntax *local_228;
  undefined8 local_220;
  undefined8 local_218;
  Info *local_210;
  Info *local_208;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_200;
  undefined1 local_1f0;
  Token local_1e8;
  Token local_1d8;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [24];
  __extent_storage<18446744073709551615UL> local_198;
  
  pIVar7 = openBrace.info;
  uVar8 = openBrace._0_8_;
  TVar10 = ParserBase::consume(&this->super_ParserBase);
  local_208 = TVar10.info;
  uVar3 = TVar10._0_8_;
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
  if (bVar1) {
    local_228 = (ExpressionSyntax *)0x0;
  }
  else {
    local_228 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
  }
  Token::Token(&local_1d8);
  Token::Token(&local_238);
  local_1d8 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  if (((undefined1  [16])local_1d8 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
    SVar4 = Token::location(&local_1d8);
    local_238 = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar4);
    auStack_1b0._16_8_ = (pointer)0x0;
    auStack_1b0._8_8_ = (Info *)0x0;
    goto LAB_00304b25;
  }
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = (SyntaxNode *)0x10;
  local_248 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(local_248.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar4 = Token::location(&local_248);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x520005,SVar4);
    }
    local_238 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
LAB_0030492f:
    src = local_238.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(local_248.kind);
    if (bVar1) {
      local_220 = uVar3;
      local_218 = uVar8;
      local_210 = pIVar7;
      do {
        pSVar5 = parseStreamExpression(this);
        local_200._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar5;
        local_1f0 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_200._M_first);
        TVar10 = ParserBase::peek(&this->super_ParserBase);
        TVar9 = TVar10.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar9);
        iVar2 = 3;
        src = extraout_RDX;
        if (TVar9 != EndOfFile && !bVar1) {
          if (TVar9 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                                (&this->super_ParserBase,(DiagCode)0x520005,false);
              if (!bVar1) {
                local_238 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
                src = local_238.info;
                iVar2 = 1;
                goto LAB_00304aa5;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_200._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_1f0 = 0;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_200._M_first);
          TVar10 = ParserBase::peek(&this->super_ParserBase);
          TVar9 = TVar10.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar9);
          if (TVar9 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            src = extraout_RDX_01;
          }
          else {
            src = extraout_RDX_00;
            if ((local_248.kind == TVar9) && (local_248.info == TVar10.info)) {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                                (&this->super_ParserBase,(DiagCode)0x520005,true);
              src = extraout_RDX_02;
              if (!bVar1) goto LAB_00304aa5;
            }
            iVar2 = 0;
            local_248 = TVar10;
          }
        }
LAB_00304aa5:
        pIVar7 = local_210;
        uVar8 = local_218;
        uVar3 = local_220;
      } while (iVar2 == 0);
      if (iVar2 == 3) {
        local_238 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
        goto LAB_0030492f;
      }
    }
    else {
      ParserBase::reportMissingList
                (&this->super_ParserBase,local_248,CloseBrace,&local_238,(DiagCode)0x520005);
      src = extraout_RDX_03;
    }
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  auStack_1b0._16_8_ = CONCAT44(extraout_var,iVar2);
  auStack_1b0._8_8_ = extraout_RDX_04;
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
LAB_00304b25:
  local_1e8 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
  local_1c8._8_4_ = 3;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  local_1c8._0_8_ = &PTR_getChild_005bc150;
  operatorToken.info = local_208;
  operatorToken.kind = (short)uVar3;
  operatorToken._2_1_ = (char)((ulong)uVar3 >> 0x10);
  operatorToken.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
  operatorToken.rawLen = (int)((ulong)uVar3 >> 0x20);
  openBrace_00.info = pIVar7;
  openBrace_00.kind = (short)uVar8;
  openBrace_00._2_1_ = (char)((ulong)uVar8 >> 0x10);
  openBrace_00.numFlags.raw = (char)((ulong)uVar8 >> 0x18);
  openBrace_00.rawLen = (int)((ulong)uVar8 >> 0x20);
  local_198._M_extent_value = auStack_1b0._8_8_;
  pSVar6 = slang::syntax::SyntaxFactory::streamingConcatenationExpression
                     (&this->factory,openBrace_00,operatorToken,local_228,local_1d8,
                      (SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)local_1c8,
                      local_238,local_1e8);
  return pSVar6;
}

Assistant:

StreamingConcatenationExpressionSyntax& Parser::parseStreamConcatenation(Token openBrace) {
    auto op = consume();
    ExpressionSyntax* sliceSize = nullptr;
    if (!peek(TokenKind::OpenBrace))
        sliceSize = &parseExpression();

    Token openBraceInner;
    Token closeBraceInner;
    std::span<TokenOrSyntax> list;

    parseList<isPossibleExpressionOrComma, isEndOfBracedList>(
        TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBraceInner, list,
        closeBraceInner, RequireItems::True, diag::ExpectedStreamExpression,
        [this] { return &parseStreamExpression(); });

    auto closeBrace = expect(TokenKind::CloseBrace);
    return factory.streamingConcatenationExpression(openBrace, op, sliceSize, openBraceInner, list,
                                                    closeBraceInner, closeBrace);
}